

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O2

bool __thiscall
ON_OutlineAccumulator::BeginFigure
          (ON_OutlineAccumulator *this,Type point_type,ON_2fPoint point_location)

{
  bool bVar1;
  char *sFormat;
  int line_number;
  
  if (this[4] == (ON_OutlineAccumulator)0x1) {
    bVar1 = ON_OutlineFigurePoint::IsBeginFigurePointType(point_type);
    if (bVar1) {
      bVar1 = Internal_AccumulatePoint(this,point_type,point_location,true);
      return bVar1;
    }
    sFormat = "Invalid point_type for BeginFigure2f.";
    line_number = 0x989;
  }
  else {
    sFormat = "ON_OutlineAccumulator is not initialized.";
    line_number = 0x982;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
             ,line_number,"",sFormat);
  *(int *)(this + 0xc) = *(int *)(this + 0xc) + 1;
  *(undefined4 *)(this + 8) = 0;
  return false;
}

Assistant:

bool ON_OutlineAccumulator::BeginFigure(
  ON_OutlineFigurePoint::Type point_type,
  ON_2fPoint point_location
)
{
  if (1 != m_status)
  {
    ON_ERROR("ON_OutlineAccumulator is not initialized.");
    Internal_AccumulateError(true);
    return false;
  }

  if ( false == ON_OutlineFigurePoint::IsBeginFigurePointType(point_type) )
  {
    ON_ERROR("Invalid point_type for BeginFigure2f.");
    Internal_AccumulateError(true);
    return false;
  }

  return Internal_AccumulatePoint(point_type,point_location, true);
}